

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkLineDeviceComputer.cxx
# Opt level: O1

string * __thiscall
cmLinkLineDeviceComputer::ComputeLinkLibraries
          (string *__return_storage_ptr__,cmLinkLineDeviceComputer *this,
          cmComputeLinkInformation *cli,string *stdLibString)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer pIVar3;
  cmGeneratorTarget *this_00;
  ulong uVar4;
  char *__s1;
  string *psVar5;
  cmLinkLineComputer *this_01;
  bool bVar6;
  TargetType TVar7;
  int iVar8;
  ItemVector *pIVar9;
  ostream *poVar10;
  size_t len;
  pointer pIVar11;
  bool bVar12;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar13;
  string out;
  string config;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emitted;
  ostringstream fout;
  string local_270;
  string local_250;
  string *local_230;
  string *local_228;
  cmLinkLineComputer *local_220;
  long *local_218 [2];
  long local_208 [2];
  string local_1f8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d8;
  undefined1 local_1a8 [376];
  
  local_220 = &this->super_cmLinkLineComputer;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  local_1d8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1d8._M_impl.super__Rb_tree_header._M_header;
  local_1d8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1d8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1d8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1d8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1d8._M_impl.super__Rb_tree_header._M_header._M_left;
  pIVar9 = cmComputeLinkInformation::GetItems(cli);
  local_218[0] = local_208;
  pcVar2 = (cli->Config)._M_dataplus._M_p;
  local_230 = stdLibString;
  local_228 = __return_storage_ptr__;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_218,pcVar2,pcVar2 + (cli->Config)._M_string_length);
  pIVar11 = (pIVar9->
            super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pIVar3 = (pIVar9->
           super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pIVar11 != pIVar3) {
    paVar1 = &local_270.field_2;
    bVar12 = false;
    do {
      if (bVar12) {
        bVar12 = false;
        goto LAB_0033bbfd;
      }
      if (pIVar11->Target == (cmGeneratorTarget *)0x0) {
LAB_0033ba2e:
        local_270._M_string_length = 0;
        local_270.field_2._M_local_buf[0] = '\0';
        if (pIVar11->IsPath == true) {
          uVar4 = (pIVar11->Value)._M_string_length;
          local_270._M_dataplus._M_p = (pointer)paVar1;
          if (((1 < uVar4) &&
              (iVar8 = strcmp((pIVar11->Value)._M_dataplus._M_p + (uVar4 - 2),".a"), iVar8 == 0)) ||
             ((3 < uVar4 &&
              (iVar8 = strcmp((pIVar11->Value)._M_dataplus._M_p + (uVar4 - 4),".lib"), iVar8 == 0)))
             ) {
            this_01 = local_220;
            (*local_220->_vptr_cmLinkLineComputer[2])(&local_1f8,local_220,pIVar11);
            cmLinkLineComputer::ConvertToOutputFormat(&local_250,this_01,&local_1f8);
            std::__cxx11::string::_M_append((char *)&local_270,(ulong)local_250._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_250._M_dataplus._M_p != &local_250.field_2) {
              operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
              operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1
                             );
            }
          }
LAB_0033bb9f:
          pVar13 = std::
                   _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                   ::_M_insert_unique<std::__cxx11::string_const&>
                             ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                               *)&local_1d8,&local_270);
          if (((undefined1  [16])pVar13 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1a8,local_270._M_dataplus._M_p,
                                 local_270._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
          }
        }
        else {
          local_270._M_dataplus._M_p = (pointer)paVar1;
          iVar8 = std::__cxx11::string::compare((char *)pIVar11);
          if (iVar8 != 0) {
            __s1 = (pIVar11->Value)._M_dataplus._M_p;
            if ((((*__s1 != '-') || (iVar8 = strncmp(__s1,"-l",2), iVar8 == 0)) ||
                (iVar8 = strncmp(__s1,"-L",2), iVar8 == 0)) ||
               (iVar8 = strncmp(__s1,"--library",9), iVar8 == 0)) {
              std::__cxx11::string::_M_append((char *)&local_270,(ulong)__s1);
            }
            goto LAB_0033bb9f;
          }
          bVar12 = true;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_270._M_dataplus._M_p != paVar1) {
          operator_delete(local_270._M_dataplus._M_p,
                          CONCAT71(local_270.field_2._M_allocated_capacity._1_7_,
                                   local_270.field_2._M_local_buf[0]) + 1);
        }
      }
      else {
        TVar7 = cmGeneratorTarget::GetType(pIVar11->Target);
        if (TVar7 == STATIC_LIBRARY) {
          this_00 = pIVar11->Target;
          local_270._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_270,"CUDA_RESOLVE_DEVICE_SYMBOLS","");
          bVar6 = cmGeneratorTarget::GetPropertyAsBool(this_00,&local_270);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p != paVar1) {
            operator_delete(local_270._M_dataplus._M_p,
                            CONCAT71(local_270.field_2._M_allocated_capacity._1_7_,
                                     local_270.field_2._M_local_buf[0]) + 1);
          }
          if (!bVar6) goto LAB_0033ba2e;
        }
        else if ((TVar7 != MODULE_LIBRARY) && (TVar7 != INTERFACE_LIBRARY)) goto LAB_0033ba2e;
      }
LAB_0033bbfd:
      pIVar11 = pIVar11 + 1;
    } while (pIVar11 != pIVar3);
  }
  psVar5 = local_228;
  if (local_230->_M_string_length != 0) {
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,(local_230->_M_dataplus)._M_p,
                         local_230->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
  }
  std::__cxx11::stringbuf::str();
  if (local_218[0] != local_208) {
    operator_delete(local_218[0],local_208[0] + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_1d8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return psVar5;
}

Assistant:

std::string cmLinkLineDeviceComputer::ComputeLinkLibraries(
  cmComputeLinkInformation& cli, std::string const& stdLibString)
{
  // Write the library flags to the build rule.
  std::ostringstream fout;

  // Generate the unique set of link items when device linking.
  // The nvcc device linker is designed so that each static library
  // with device symbols only needs to be listed once as it doesn't
  // care about link order.
  std::set<std::string> emitted;
  typedef cmComputeLinkInformation::ItemVector ItemVector;
  ItemVector const& items = cli.GetItems();
  std::string config = cli.GetConfig();
  bool skipItemAfterFramework = false;
  for (auto const& item : items) {
    if (skipItemAfterFramework) {
      skipItemAfterFramework = false;
      continue;
    }

    if (item.Target) {
      bool skip = false;
      switch (item.Target->GetType()) {
        case cmStateEnums::MODULE_LIBRARY:
        case cmStateEnums::INTERFACE_LIBRARY:
          skip = true;
          break;
        case cmStateEnums::STATIC_LIBRARY:
          skip = item.Target->GetPropertyAsBool("CUDA_RESOLVE_DEVICE_SYMBOLS");
          break;
        default:
          break;
      }
      if (skip) {
        continue;
      }
    }

    std::string out;
    if (item.IsPath) {
      // nvcc understands absolute paths to libraries ending in '.a' or '.lib'.
      // These should be passed to nvlink.  Other extensions need to be left
      // out because nvlink may not understand or need them.  Even though it
      // can tolerate '.so' or '.dylib' it cannot tolerate '.so.1'.
      if (cmHasLiteralSuffix(item.Value, ".a") ||
          cmHasLiteralSuffix(item.Value, ".lib")) {
        out += this->ConvertToOutputFormat(
          this->ConvertToLinkReference(item.Value));
      }
    } else if (item.Value == "-framework") {
      // This is the first part of '-framework Name' where the framework
      // name is specified as a following item.  Ignore both.
      skipItemAfterFramework = true;
      continue;
    } else if (cmLinkItemValidForDevice(item.Value)) {
      out += item.Value;
    }

    if (emitted.insert(out).second) {
      fout << out << " ";
    }
  }

  if (!stdLibString.empty()) {
    fout << stdLibString << " ";
  }

  return fout.str();
}